

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O2

void __thiscall
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_2UL>
::TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,RecalculatePrimRef<embree::TriangleMesh> *recalculatePrimRef)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  TemporalBinInfo *pTVar10;
  int iVar11;
  int iVar12;
  size_t sVar13;
  PrimRefMB *pPVar14;
  float fVar15;
  float fVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  float fVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  ulong local_150;
  PrimRefMB *local_148;
  size_t local_140;
  TemporalBinInfo *local_138;
  RecalculatePrimRef<embree::TriangleMesh> *local_130;
  BBox1f local_128;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  anon_class_16_2_4e716a3c local_c8;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  local_118 = time_range.upper;
  fVar29 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar25 = (set->super_PrimInfoMB).max_time_range.upper - fVar29;
  fVar16 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  local_138 = this;
  local_130 = recalculatePrimRef;
  local_128 = time_range;
  fStack_114 = local_118;
  fStack_110 = local_118;
  fStack_10c = local_118;
  fVar15 = roundf((((time_range.lower * 0.5 + local_118 * 0.5) - fVar29) / fVar25) * fVar16);
  fVar29 = (fVar15 / fVar16) * fVar25 + fVar29;
  if ((local_128.lower < fVar29) && (fVar29 < local_118)) {
    fVar15 = local_128.lower;
    local_148 = prims;
    local_140 = end;
    for (; begin < end; begin = begin + 1) {
      fVar16 = prims[begin].time_range.upper * 0.9999;
      pPVar14 = prims;
      if ((fVar15 < fVar16) && (prims[begin].time_range.lower * 1.0001 < fVar29)) {
        local_150 = (ulong)(uint)prims[begin].lbounds.bounds0.upper.field_0.m128[3];
        local_c8.this =
             (TriangleMesh *)
             (local_130->scene->geometries).items
             [(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3]].ptr;
        local_c8.primID = &local_150;
        fVar16 = ((local_c8.this)->super_Geometry).fnumTimeSegments;
        fVar25 = ((local_c8.this)->super_Geometry).time_range.lower;
        fVar20 = ((local_c8.this)->super_Geometry).time_range.upper - fVar25;
        fVar26 = (fVar15 - fVar25) / fVar20;
        fVar20 = (fVar29 - fVar25) / fVar20;
        fVar31 = fVar16 * fVar20;
        fVar15 = floorf(fVar16 * fVar26);
        fVar25 = ceilf(fVar31);
        iVar12 = (int)fVar15;
        if (fVar15 <= 0.0) {
          fVar15 = 0.0;
        }
        fVar21 = fVar25;
        if (fVar16 <= fVar25) {
          fVar21 = fVar16;
        }
        iVar11 = -1;
        if (-1 < iVar12) {
          iVar11 = iVar12;
        }
        iVar9 = (int)fVar16 + 1;
        if ((int)fVar25 < (int)fVar16 + 1) {
          iVar9 = (int)fVar25;
        }
        TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&blower0,&local_c8,(long)(int)fVar15);
        TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&bupper1,&local_c8,(long)(int)fVar21);
        fVar25 = fVar16 * fVar26 - fVar15;
        if (iVar9 - iVar11 == 1) {
          if (fVar25 <= 0.0) {
            fVar25 = 0.0;
          }
          fVar15 = 1.0 - fVar25;
          fVar37 = fVar15 * blower0.lower.field_0.m128[0] + fVar25 * bupper1.lower.field_0.m128[0];
          fVar38 = fVar15 * blower0.lower.field_0.m128[1] + fVar25 * bupper1.lower.field_0.m128[1];
          fVar39 = fVar15 * blower0.lower.field_0.m128[2] + fVar25 * bupper1.lower.field_0.m128[2];
          fVar40 = fVar15 * blower0.lower.field_0.m128[3] + fVar25 * bupper1.lower.field_0.m128[3];
          fVar34 = fVar15 * blower0.upper.field_0.m128[0] + fVar25 * bupper1.upper.field_0.m128[0];
          fVar35 = fVar15 * blower0.upper.field_0.m128[1] + fVar25 * bupper1.upper.field_0.m128[1];
          fVar36 = fVar15 * blower0.upper.field_0.m128[2] + fVar25 * bupper1.upper.field_0.m128[2];
          fVar25 = fVar15 * blower0.upper.field_0.m128[3] + fVar25 * bupper1.upper.field_0.m128[3];
          fVar21 = fVar21 - fVar31;
          if (fVar21 <= 0.0) {
            fVar21 = 0.0;
          }
          fVar15 = 1.0 - fVar21;
          fVar41 = bupper1.lower.field_0.m128[0] * fVar15 + blower0.lower.field_0.m128[0] * fVar21;
          fVar42 = bupper1.lower.field_0.m128[1] * fVar15 + blower0.lower.field_0.m128[1] * fVar21;
          fVar43 = bupper1.lower.field_0.m128[2] * fVar15 + blower0.lower.field_0.m128[2] * fVar21;
          fVar44 = bupper1.lower.field_0.m128[3] * fVar15 + blower0.lower.field_0.m128[3] * fVar21;
          fVar31 = fVar15 * bupper1.upper.field_0.m128[0] + fVar21 * blower0.upper.field_0.m128[0];
          fVar32 = fVar15 * bupper1.upper.field_0.m128[1] + fVar21 * blower0.upper.field_0.m128[1];
          fVar33 = fVar15 * bupper1.upper.field_0.m128[2] + fVar21 * blower0.upper.field_0.m128[2];
          fVar15 = fVar15 * bupper1.upper.field_0.m128[3] + fVar21 * blower0.upper.field_0.m128[3];
        }
        else {
          TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&blower1,&local_c8,(long)((int)fVar15 + 1));
          TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&bupper0,&local_c8,(long)((int)fVar21 + -1));
          if (fVar25 <= 0.0) {
            fVar25 = 0.0;
          }
          fVar15 = 1.0 - fVar25;
          fVar37 = blower0.lower.field_0.m128[0] * fVar15 + blower1.lower.field_0.m128[0] * fVar25;
          fVar38 = blower0.lower.field_0.m128[1] * fVar15 + blower1.lower.field_0.m128[1] * fVar25;
          fVar39 = blower0.lower.field_0.m128[2] * fVar15 + blower1.lower.field_0.m128[2] * fVar25;
          fVar40 = blower0.lower.field_0.m128[3] * fVar15 + blower1.lower.field_0.m128[3] * fVar25;
          fVar34 = fVar15 * blower0.upper.field_0.m128[0] + fVar25 * blower1.upper.field_0.m128[0];
          fVar35 = fVar15 * blower0.upper.field_0.m128[1] + fVar25 * blower1.upper.field_0.m128[1];
          fVar36 = fVar15 * blower0.upper.field_0.m128[2] + fVar25 * blower1.upper.field_0.m128[2];
          fVar25 = fVar15 * blower0.upper.field_0.m128[3] + fVar25 * blower1.upper.field_0.m128[3];
          fVar15 = fVar21 - fVar31;
          if (fVar21 - fVar31 <= 0.0) {
            fVar15 = 0.0;
          }
          fVar21 = 1.0 - fVar15;
          fVar41 = bupper1.lower.field_0.m128[0] * fVar21 + bupper0.lower.field_0.m128[0] * fVar15;
          fVar42 = bupper1.lower.field_0.m128[1] * fVar21 + bupper0.lower.field_0.m128[1] * fVar15;
          fVar43 = bupper1.lower.field_0.m128[2] * fVar21 + bupper0.lower.field_0.m128[2] * fVar15;
          fVar44 = bupper1.lower.field_0.m128[3] * fVar21 + bupper0.lower.field_0.m128[3] * fVar15;
          fVar31 = fVar21 * bupper1.upper.field_0.m128[0] + fVar15 * bupper0.upper.field_0.m128[0];
          fVar32 = fVar21 * bupper1.upper.field_0.m128[1] + fVar15 * bupper0.upper.field_0.m128[1];
          fVar33 = fVar21 * bupper1.upper.field_0.m128[2] + fVar15 * bupper0.upper.field_0.m128[2];
          fVar15 = fVar21 * bupper1.upper.field_0.m128[3] + fVar15 * bupper0.upper.field_0.m128[3];
          if (iVar12 < 0) {
            iVar12 = -1;
          }
          sVar13 = (size_t)iVar12;
          while (sVar13 = sVar13 + 1, (long)sVar13 < (long)iVar9) {
            fVar21 = ((float)(int)sVar13 / fVar16 - fVar26) / (fVar20 - fVar26);
            fVar27 = 1.0 - fVar21;
            local_a8 = fVar37 * fVar27 + fVar41 * fVar21;
            fStack_a4 = fVar38 * fVar27 + fVar42 * fVar21;
            fStack_a0 = fVar39 * fVar27 + fVar43 * fVar21;
            fStack_9c = fVar40 * fVar27 + fVar44 * fVar21;
            local_b8 = fVar27 * fVar34 + fVar21 * fVar31;
            fStack_b4 = fVar27 * fVar35 + fVar21 * fVar32;
            fStack_b0 = fVar27 * fVar36 + fVar21 * fVar33;
            fStack_ac = fVar27 * fVar25 + fVar21 * fVar15;
            TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_c8,sVar13);
            auVar19._0_4_ = bi.lower.field_0.m128[0] - local_a8;
            auVar19._4_4_ = bi.lower.field_0.m128[1] - fStack_a4;
            auVar19._8_4_ = bi.lower.field_0.m128[2] - fStack_a0;
            auVar19._12_4_ = bi.lower.field_0.m128[3] - fStack_9c;
            auVar24._0_4_ = bi.upper.field_0.m128[0] - local_b8;
            auVar24._4_4_ = bi.upper.field_0.m128[1] - fStack_b4;
            auVar24._8_4_ = bi.upper.field_0.m128[2] - fStack_b0;
            auVar24._12_4_ = bi.upper.field_0.m128[3] - fStack_ac;
            auVar19 = minps(auVar19,ZEXT816(0));
            auVar24 = maxps(auVar24,ZEXT816(0));
            fVar37 = fVar37 + auVar19._0_4_;
            fVar38 = fVar38 + auVar19._4_4_;
            fVar39 = fVar39 + auVar19._8_4_;
            fVar40 = fVar40 + auVar19._12_4_;
            fVar41 = fVar41 + auVar19._0_4_;
            fVar42 = fVar42 + auVar19._4_4_;
            fVar43 = fVar43 + auVar19._8_4_;
            fVar44 = fVar44 + auVar19._12_4_;
            fVar34 = fVar34 + auVar24._0_4_;
            fVar35 = fVar35 + auVar24._4_4_;
            fVar36 = fVar36 + auVar24._8_4_;
            fVar25 = fVar25 + auVar24._12_4_;
            fVar31 = fVar31 + auVar24._0_4_;
            fVar32 = fVar32 + auVar24._4_4_;
            fVar33 = fVar33 + auVar24._8_4_;
            fVar15 = fVar15 + auVar24._12_4_;
          }
        }
        pTVar10 = local_138;
        auVar5._4_4_ = fVar38;
        auVar5._0_4_ = fVar37;
        auVar5._8_4_ = fVar39;
        auVar5._12_4_ = fVar40;
        aVar17.m128 = (__m128)minps(local_138->bounds0[0].bounds0.lower.field_0,auVar5);
        auVar3._4_4_ = fVar35;
        auVar3._0_4_ = fVar34;
        auVar3._8_4_ = fVar36;
        auVar3._12_4_ = fVar25;
        aVar22.m128 = (__m128)maxps(local_138->bounds0[0].bounds0.upper.field_0,auVar3);
        auVar7._4_4_ = fVar42;
        auVar7._0_4_ = fVar41;
        auVar7._8_4_ = fVar43;
        auVar7._12_4_ = fVar44;
        aVar28.m128 = (__m128)minps(local_138->bounds0[0].bounds1.lower.field_0,auVar7);
        auVar1._4_4_ = fVar32;
        auVar1._0_4_ = fVar31;
        auVar1._8_4_ = fVar33;
        auVar1._12_4_ = fVar15;
        aVar30.m128 = (__m128)maxps(local_138->bounds0[0].bounds1.upper.field_0,auVar1);
        local_138->bounds0[0].bounds0.lower.field_0 = aVar17;
        local_138->bounds0[0].bounds0.upper.field_0 = aVar22;
        local_138->bounds0[0].bounds1.lower.field_0 = aVar28;
        local_138->bounds0[0].bounds1.upper.field_0 = aVar30;
        fVar26 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar25 = prims[begin].time_range.lower;
        fVar20 = prims[begin].time_range.upper - fVar25;
        fVar16 = floorf(((local_128.lower - fVar25) / fVar20) * 1.0000002 * fVar26);
        fVar15 = 0.0;
        if (0.0 <= fVar16) {
          fVar15 = fVar16;
        }
        fVar16 = ceilf(((fVar29 - fVar25) / fVar20) * 0.99999976 * fVar26);
        if (fVar26 <= fVar16) {
          fVar16 = fVar26;
        }
        pTVar10->count0[0] = pTVar10->count0[0] + (long)((int)fVar16 - (int)fVar15);
        fVar16 = prims[begin].time_range.upper * 0.9999;
        end = local_140;
        pPVar14 = local_148;
        fVar15 = local_128.lower;
      }
      if ((fVar29 < fVar16) && (prims[begin].time_range.lower * 1.0001 < local_118)) {
        local_150 = (ulong)(uint)prims[begin].lbounds.bounds0.upper.field_0.m128[3];
        local_c8.this =
             (TriangleMesh *)
             (local_130->scene->geometries).items
             [(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3]].ptr;
        local_c8.primID = &local_150;
        fVar15 = ((local_c8.this)->super_Geometry).fnumTimeSegments;
        fVar16 = ((local_c8.this)->super_Geometry).time_range.lower;
        fVar20 = ((local_c8.this)->super_Geometry).time_range.upper - fVar16;
        fVar26 = (fVar29 - fVar16) / fVar20;
        fVar20 = (local_118 - fVar16) / fVar20;
        fVar31 = fVar15 * fVar20;
        fVar16 = floorf(fVar15 * fVar26);
        fVar25 = ceilf(fVar31);
        iVar12 = (int)fVar16;
        if (fVar16 <= 0.0) {
          fVar16 = 0.0;
        }
        fVar21 = fVar25;
        if (fVar15 <= fVar25) {
          fVar21 = fVar15;
        }
        iVar11 = -1;
        if (-1 < iVar12) {
          iVar11 = iVar12;
        }
        iVar9 = (int)fVar15 + 1;
        if ((int)fVar25 < (int)fVar15 + 1) {
          iVar9 = (int)fVar25;
        }
        TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&blower0,&local_c8,(long)(int)fVar16);
        TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                  (&bupper1,&local_c8,(long)(int)fVar21);
        fVar25 = fVar15 * fVar26 - fVar16;
        if (iVar9 - iVar11 == 1) {
          if (fVar25 <= 0.0) {
            fVar25 = 0.0;
          }
          fVar15 = 1.0 - fVar25;
          fVar37 = fVar15 * blower0.lower.field_0.m128[0] + fVar25 * bupper1.lower.field_0.m128[0];
          fVar38 = fVar15 * blower0.lower.field_0.m128[1] + fVar25 * bupper1.lower.field_0.m128[1];
          fVar39 = fVar15 * blower0.lower.field_0.m128[2] + fVar25 * bupper1.lower.field_0.m128[2];
          fVar40 = fVar15 * blower0.lower.field_0.m128[3] + fVar25 * bupper1.lower.field_0.m128[3];
          fVar34 = fVar15 * blower0.upper.field_0.m128[0] + fVar25 * bupper1.upper.field_0.m128[0];
          fVar35 = fVar15 * blower0.upper.field_0.m128[1] + fVar25 * bupper1.upper.field_0.m128[1];
          fVar36 = fVar15 * blower0.upper.field_0.m128[2] + fVar25 * bupper1.upper.field_0.m128[2];
          fVar25 = fVar15 * blower0.upper.field_0.m128[3] + fVar25 * bupper1.upper.field_0.m128[3];
          fVar21 = fVar21 - fVar31;
          if (fVar21 <= 0.0) {
            fVar21 = 0.0;
          }
          fVar15 = 1.0 - fVar21;
          fVar41 = bupper1.lower.field_0.m128[0] * fVar15 + blower0.lower.field_0.m128[0] * fVar21;
          fVar42 = bupper1.lower.field_0.m128[1] * fVar15 + blower0.lower.field_0.m128[1] * fVar21;
          fVar43 = bupper1.lower.field_0.m128[2] * fVar15 + blower0.lower.field_0.m128[2] * fVar21;
          fVar44 = bupper1.lower.field_0.m128[3] * fVar15 + blower0.lower.field_0.m128[3] * fVar21;
          fVar31 = fVar15 * bupper1.upper.field_0.m128[0] + fVar21 * blower0.upper.field_0.m128[0];
          fVar32 = fVar15 * bupper1.upper.field_0.m128[1] + fVar21 * blower0.upper.field_0.m128[1];
          fVar33 = fVar15 * bupper1.upper.field_0.m128[2] + fVar21 * blower0.upper.field_0.m128[2];
          fVar16 = fVar15 * bupper1.upper.field_0.m128[3] + fVar21 * blower0.upper.field_0.m128[3];
        }
        else {
          TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&blower1,&local_c8,(long)((int)fVar16 + 1));
          TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                    (&bupper0,&local_c8,(long)((int)fVar21 + -1));
          if (fVar25 <= 0.0) {
            fVar25 = 0.0;
          }
          fVar16 = 1.0 - fVar25;
          fVar37 = blower0.lower.field_0.m128[0] * fVar16 + blower1.lower.field_0.m128[0] * fVar25;
          fVar38 = blower0.lower.field_0.m128[1] * fVar16 + blower1.lower.field_0.m128[1] * fVar25;
          fVar39 = blower0.lower.field_0.m128[2] * fVar16 + blower1.lower.field_0.m128[2] * fVar25;
          fVar40 = blower0.lower.field_0.m128[3] * fVar16 + blower1.lower.field_0.m128[3] * fVar25;
          fVar34 = fVar16 * blower0.upper.field_0.m128[0] + fVar25 * blower1.upper.field_0.m128[0];
          fVar35 = fVar16 * blower0.upper.field_0.m128[1] + fVar25 * blower1.upper.field_0.m128[1];
          fVar36 = fVar16 * blower0.upper.field_0.m128[2] + fVar25 * blower1.upper.field_0.m128[2];
          fVar25 = fVar16 * blower0.upper.field_0.m128[3] + fVar25 * blower1.upper.field_0.m128[3];
          fVar16 = fVar21 - fVar31;
          if (fVar21 - fVar31 <= 0.0) {
            fVar16 = 0.0;
          }
          fVar21 = 1.0 - fVar16;
          fVar41 = bupper1.lower.field_0.m128[0] * fVar21 + bupper0.lower.field_0.m128[0] * fVar16;
          fVar42 = bupper1.lower.field_0.m128[1] * fVar21 + bupper0.lower.field_0.m128[1] * fVar16;
          fVar43 = bupper1.lower.field_0.m128[2] * fVar21 + bupper0.lower.field_0.m128[2] * fVar16;
          fVar44 = bupper1.lower.field_0.m128[3] * fVar21 + bupper0.lower.field_0.m128[3] * fVar16;
          fVar31 = fVar21 * bupper1.upper.field_0.m128[0] + fVar16 * bupper0.upper.field_0.m128[0];
          fVar32 = fVar21 * bupper1.upper.field_0.m128[1] + fVar16 * bupper0.upper.field_0.m128[1];
          fVar33 = fVar21 * bupper1.upper.field_0.m128[2] + fVar16 * bupper0.upper.field_0.m128[2];
          fVar16 = fVar21 * bupper1.upper.field_0.m128[3] + fVar16 * bupper0.upper.field_0.m128[3];
          if (iVar12 < 0) {
            iVar12 = -1;
          }
          sVar13 = (size_t)iVar12;
          while (sVar13 = sVar13 + 1, (long)sVar13 < (long)iVar9) {
            fVar21 = ((float)(int)sVar13 / fVar15 - fVar26) / (fVar20 - fVar26);
            fVar27 = 1.0 - fVar21;
            local_a8 = fVar37 * fVar27 + fVar41 * fVar21;
            fStack_a4 = fVar38 * fVar27 + fVar42 * fVar21;
            fStack_a0 = fVar39 * fVar27 + fVar43 * fVar21;
            fStack_9c = fVar40 * fVar27 + fVar44 * fVar21;
            local_b8 = fVar27 * fVar34 + fVar21 * fVar31;
            fStack_b4 = fVar27 * fVar35 + fVar21 * fVar32;
            fStack_b0 = fVar27 * fVar36 + fVar21 * fVar33;
            fStack_ac = fVar27 * fVar25 + fVar21 * fVar16;
            TriangleMesh::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_c8,sVar13);
            auVar18._0_4_ = bi.lower.field_0.m128[0] - local_a8;
            auVar18._4_4_ = bi.lower.field_0.m128[1] - fStack_a4;
            auVar18._8_4_ = bi.lower.field_0.m128[2] - fStack_a0;
            auVar18._12_4_ = bi.lower.field_0.m128[3] - fStack_9c;
            auVar23._0_4_ = bi.upper.field_0.m128[0] - local_b8;
            auVar23._4_4_ = bi.upper.field_0.m128[1] - fStack_b4;
            auVar23._8_4_ = bi.upper.field_0.m128[2] - fStack_b0;
            auVar23._12_4_ = bi.upper.field_0.m128[3] - fStack_ac;
            auVar19 = minps(auVar18,ZEXT816(0));
            auVar24 = maxps(auVar23,ZEXT816(0));
            fVar37 = fVar37 + auVar19._0_4_;
            fVar38 = fVar38 + auVar19._4_4_;
            fVar39 = fVar39 + auVar19._8_4_;
            fVar40 = fVar40 + auVar19._12_4_;
            fVar41 = fVar41 + auVar19._0_4_;
            fVar42 = fVar42 + auVar19._4_4_;
            fVar43 = fVar43 + auVar19._8_4_;
            fVar44 = fVar44 + auVar19._12_4_;
            fVar34 = fVar34 + auVar24._0_4_;
            fVar35 = fVar35 + auVar24._4_4_;
            fVar36 = fVar36 + auVar24._8_4_;
            fVar25 = fVar25 + auVar24._12_4_;
            fVar31 = fVar31 + auVar24._0_4_;
            fVar32 = fVar32 + auVar24._4_4_;
            fVar33 = fVar33 + auVar24._8_4_;
            fVar16 = fVar16 + auVar24._12_4_;
          }
        }
        pTVar10 = local_138;
        auVar6._4_4_ = fVar38;
        auVar6._0_4_ = fVar37;
        auVar6._8_4_ = fVar39;
        auVar6._12_4_ = fVar40;
        aVar17.m128 = (__m128)minps(local_138->bounds1[0].bounds0.lower.field_0,auVar6);
        auVar4._4_4_ = fVar35;
        auVar4._0_4_ = fVar34;
        auVar4._8_4_ = fVar36;
        auVar4._12_4_ = fVar25;
        aVar22.m128 = (__m128)maxps(local_138->bounds1[0].bounds0.upper.field_0,auVar4);
        auVar8._4_4_ = fVar42;
        auVar8._0_4_ = fVar41;
        auVar8._8_4_ = fVar43;
        auVar8._12_4_ = fVar44;
        aVar28.m128 = (__m128)minps(local_138->bounds1[0].bounds1.lower.field_0,auVar8);
        auVar2._4_4_ = fVar32;
        auVar2._0_4_ = fVar31;
        auVar2._8_4_ = fVar33;
        auVar2._12_4_ = fVar16;
        aVar30.m128 = (__m128)maxps(local_138->bounds1[0].bounds1.upper.field_0,auVar2);
        local_138->bounds1[0].bounds0.lower.field_0 = aVar17;
        local_138->bounds1[0].bounds0.upper.field_0 = aVar22;
        local_138->bounds1[0].bounds1.lower.field_0 = aVar28;
        local_138->bounds1[0].bounds1.upper.field_0 = aVar30;
        fVar26 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar15 = prims[begin].time_range.lower;
        fVar25 = prims[begin].time_range.upper - fVar15;
        fVar20 = local_118 - fVar15;
        fVar16 = floorf(((fVar29 - fVar15) / fVar25) * 1.0000002 * fVar26);
        fVar15 = 0.0;
        if (0.0 <= fVar16) {
          fVar15 = fVar16;
        }
        fVar16 = ceilf((fVar20 / fVar25) * 0.99999976 * fVar26);
        if (fVar26 <= fVar16) {
          fVar16 = fVar26;
        }
        pTVar10->count1[0] = pTVar10->count1[0] + (long)((int)fVar16 - (int)fVar15);
        end = local_140;
        pPVar14 = local_148;
        fVar15 = local_128.lower;
      }
      prims = pPVar14;
    }
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }